

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O0

void __thiscall ChronoTest_FormatDefault_Test::TestBody(ChronoTest_FormatDefault_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  undefined7 in_stack_fffffffffffff6c8;
  undefined1 in_stack_fffffffffffff6cf;
  char *in_stack_fffffffffffff6d0;
  duration<int,std::ratio<15l,4l>> *this_01;
  char *in_stack_fffffffffffff6d8;
  int iVar2;
  string *expected_expression;
  char *in_stack_fffffffffffff6e0;
  Type in_stack_fffffffffffff6ec;
  Type type;
  duration<long,_std::ratio<3600L,_1L>_> *in_stack_fffffffffffff6f0;
  duration<int,std::ratio<15l,1l>> *this_02;
  char (*in_stack_fffffffffffff6f8) [3];
  string *format_str;
  Message *in_stack_fffffffffffff738;
  Message *message;
  AssertHelper *in_stack_fffffffffffff740;
  int local_670;
  duration<int,std::ratio<15l,4l>> local_66c [4];
  string local_668 [32];
  AssertionResult local_648 [2];
  int local_628;
  duration<int,std::ratio<15l,1l>> local_624 [4];
  string local_620 [32];
  AssertionResult local_600 [2];
  int local_5dc;
  duration<long,std::ratio<3600l,1l>> local_5d8 [8];
  string local_5d0 [32];
  AssertionResult local_5b0 [2];
  int local_58c;
  duration<long,std::ratio<60l,1l>> local_588 [8];
  Message local_580 [4];
  AssertionResult local_560 [2];
  int local_540;
  duration<int,std::ratio<1000000000000000000l,1l>> local_53c [4];
  string local_538 [32];
  AssertionResult local_518 [2];
  int local_4f8;
  duration<int,std::ratio<1000000000000000l,1l>> local_4f4 [4];
  string local_4f0 [32];
  AssertionResult local_4d0 [2];
  int local_4b0;
  duration<int,std::ratio<1000000000000l,1l>> local_4ac [4];
  string local_4a8 [32];
  AssertionResult local_488 [2];
  int local_468;
  duration<int,std::ratio<1000000000l,1l>> local_464 [4];
  string local_460 [32];
  AssertionResult local_440 [2];
  int local_420;
  duration<int,std::ratio<1000000l,1l>> local_41c [4];
  string local_418 [32];
  AssertionResult local_3f8 [2];
  int local_3d8;
  duration<int,std::ratio<1000l,1l>> local_3d4 [4];
  string local_3d0 [32];
  AssertionResult local_3b0 [2];
  int local_390;
  duration<int,std::ratio<100l,1l>> local_38c [4];
  string local_388 [32];
  AssertionResult local_368 [2];
  int local_348;
  duration<int,std::ratio<10l,1l>> local_344 [4];
  string local_340 [32];
  AssertionResult local_320 [2];
  int local_2fc;
  duration<long,std::ratio<1l,1l>> local_2f8 [8];
  string local_2f0 [32];
  AssertionResult local_2d0 [2];
  int local_2b0;
  duration<int,std::ratio<1l,10l>> local_2ac [4];
  string local_2a8 [32];
  AssertionResult local_288 [2];
  int local_268;
  duration<int,std::ratio<1l,100l>> local_264 [4];
  string local_260 [32];
  AssertionResult local_240 [2];
  int local_21c;
  duration<long,std::ratio<1l,1000l>> local_218 [8];
  string local_210 [32];
  AssertionResult local_1f0 [2];
  int local_1cc;
  duration<long,std::ratio<1l,1000000l>> local_1c8 [8];
  string local_1c0 [32];
  AssertionResult local_1a0 [2];
  int local_17c;
  duration<long,std::ratio<1l,1000000000l>> local_178 [8];
  string local_170 [32];
  AssertionResult local_150 [2];
  int local_130;
  duration<int,std::ratio<1l,1000000000000l>> local_12c [4];
  string local_128 [32];
  AssertionResult local_108 [2];
  int local_e8;
  duration<int,std::ratio<1l,1000000000000000l>> local_e4 [4];
  string local_e0 [32];
  AssertionResult local_c0 [2];
  int local_a0;
  duration<int,std::ratio<1l,1000000000000000000l>> local_9c [4];
  string local_98 [32];
  AssertionResult local_78 [3];
  int local_44;
  duration<long,std::ratio<1l,1l>> local_40 [8];
  string local_38 [32];
  AssertionResult local_18;
  
  local_44 = 0x2a;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_40,&local_44);
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10b1a7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10b20a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b262);
  local_a0 = 0x2a;
  std::chrono::duration<int,std::ratio<1l,1000000000000000000l>>::duration<int,void>
            (local_9c,&local_a0);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,1000000000000000000l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1L,_1000000000000000000L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10b37c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10b3df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b437);
  local_e8 = 0x2a;
  std::chrono::duration<int,std::ratio<1l,1000000000000000l>>::duration<int,void>
            (local_e4,&local_e8);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,1000000000000000l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1L,_1000000000000000L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10b551);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10b5b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b60c);
  local_130 = 0x2a;
  std::chrono::duration<int,std::ratio<1l,1000000000000l>>::duration<int,void>(local_12c,&local_130)
  ;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,1000000000000l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1L,_1000000000000L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10b726);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10b789);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b7e1);
  local_17c = 0x2a;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>(local_178,&local_17c);
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (in_stack_fffffffffffff6f8,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10b8fb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10b95e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b9b6);
  local_1cc = 0x2a;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_1c8,&local_1cc);
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (in_stack_fffffffffffff6f8,
             (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10bad0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10bb33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bb8b);
  local_21c = 0x2a;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_218,&local_21c);
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1000l>>>
            (in_stack_fffffffffffff6f8,
             (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10bca5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10bd08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bd60);
  local_268 = 0x2a;
  std::chrono::duration<int,std::ratio<1l,100l>>::duration<int,void>(local_264,&local_268);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,100l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1L,_100L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10be7a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10bedd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf35);
  local_2b0 = 0x2a;
  std::chrono::duration<int,std::ratio<1l,10l>>::duration<int,void>(local_2ac,&local_2b0);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,10l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1L,_10L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_288);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c04f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10c0b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c10a);
  local_2fc = 0x2a;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_2f8,&local_2fc);
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c224);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10c287);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c2df);
  local_348 = 0x2a;
  std::chrono::duration<int,std::ratio<10l,1l>>::duration<int,void>(local_344,&local_348);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<10l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<10L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_320);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c3f9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10c45c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c4b4);
  local_390 = 0x2a;
  std::chrono::duration<int,std::ratio<100l,1l>>::duration<int,void>(local_38c,&local_390);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<100l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<100L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c5ce);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10c631);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c689);
  local_3d8 = 0x2a;
  std::chrono::duration<int,std::ratio<1000l,1l>>::duration<int,void>(local_3d4,&local_3d8);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1000L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c7a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10c806);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c85e);
  local_420 = 0x2a;
  std::chrono::duration<int,std::ratio<1000000l,1l>>::duration<int,void>(local_41c,&local_420);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1000000L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_418);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c978);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10c9db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ca33);
  local_468 = 0x2a;
  std::chrono::duration<int,std::ratio<1000000000l,1l>>::duration<int,void>(local_464,&local_468);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1000000000L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10cb4d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10cbb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cc08);
  local_4b0 = 0x2a;
  std::chrono::duration<int,std::ratio<1000000000000l,1l>>::duration<int,void>(local_4ac,&local_4b0)
  ;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000000l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1000000000000L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10cd22);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10cd85);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cddd);
  local_4f8 = 0x2a;
  std::chrono::duration<int,std::ratio<1000000000000000l,1l>>::duration<int,void>
            (local_4f4,&local_4f8);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000000000l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1000000000000000L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10cef7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10cf5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cfb2);
  local_540 = 0x2a;
  std::chrono::duration<int,std::ratio<1000000000000000000l,1l>>::duration<int,void>
            (local_53c,&local_540);
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000000000000l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<int,_std::ratio<1000000000000000000L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_518);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    in_stack_fffffffffffff740 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10d0cc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10d12f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d187);
  local_58c = 0x2a;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_588,&local_58c);
  message = local_580;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<60l,1l>>>
            (in_stack_fffffffffffff6f8,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string((string *)local_580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10d295);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10d2f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d34a);
  local_5dc = 0x2a;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_5d8,&local_5dc);
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<3600l,1l>>>
            (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_5d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10d452);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
               in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10d4af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d507);
  local_628 = 0x2a;
  this_02 = local_624;
  std::chrono::duration<int,std::ratio<15l,1l>>::duration<int,void>(this_02,&local_628);
  format_str = local_620;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<15l,1l>>>
            ((char (*) [3])format_str,(duration<int,_std::ratio<15L,_1L>_> *)this_02);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
             (char (*) [8])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  iVar2 = (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20);
  std::__cxx11::string::~string(local_620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_600);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff6ec);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_fffffffffffff6e0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10d60f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,in_stack_fffffffffffff6e0,iVar2,
               in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x10d66c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d6c4);
  local_670 = 0x2a;
  this_01 = local_66c;
  std::chrono::duration<int,std::ratio<15l,4l>>::duration<int,void>(this_01,&local_670);
  expected_expression = local_668;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<15l,4l>>>
            ((char (*) [3])format_str,(duration<int,_std::ratio<15L,_4L>_> *)this_02);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((char *)expected_expression,(char *)this_01,
             (char (*) [10])CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0);
  iVar2 = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_648);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10d7cc)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,in_stack_fffffffffffff6e0,iVar2,(char *)this_01);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff740,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10d829);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d87e);
  return;
}

Assistant:

TEST(ChronoTest, FormatDefault) {
  EXPECT_EQ("42s", fmt::format("{}", std::chrono::seconds(42)));
  EXPECT_EQ("42as",
            fmt::format("{}", std::chrono::duration<int, std::atto>(42)));
  EXPECT_EQ("42fs",
            fmt::format("{}", std::chrono::duration<int, std::femto>(42)));
  EXPECT_EQ("42ps",
            fmt::format("{}", std::chrono::duration<int, std::pico>(42)));
  EXPECT_EQ("42ns", fmt::format("{}", std::chrono::nanoseconds(42)));
  EXPECT_EQ("42µs", fmt::format("{}", std::chrono::microseconds(42)));
  EXPECT_EQ("42ms", fmt::format("{}", std::chrono::milliseconds(42)));
  EXPECT_EQ("42cs",
            fmt::format("{}", std::chrono::duration<int, std::centi>(42)));
  EXPECT_EQ("42ds",
            fmt::format("{}", std::chrono::duration<int, std::deci>(42)));
  EXPECT_EQ("42s", fmt::format("{}", std::chrono::seconds(42)));
  EXPECT_EQ("42das",
            fmt::format("{}", std::chrono::duration<int, std::deca>(42)));
  EXPECT_EQ("42hs",
            fmt::format("{}", std::chrono::duration<int, std::hecto>(42)));
  EXPECT_EQ("42ks",
            fmt::format("{}", std::chrono::duration<int, std::kilo>(42)));
  EXPECT_EQ("42Ms",
            fmt::format("{}", std::chrono::duration<int, std::mega>(42)));
  EXPECT_EQ("42Gs",
            fmt::format("{}", std::chrono::duration<int, std::giga>(42)));
  EXPECT_EQ("42Ts",
            fmt::format("{}", std::chrono::duration<int, std::tera>(42)));
  EXPECT_EQ("42Ps",
            fmt::format("{}", std::chrono::duration<int, std::peta>(42)));
  EXPECT_EQ("42Es",
            fmt::format("{}", std::chrono::duration<int, std::exa>(42)));
  EXPECT_EQ("42m", fmt::format("{}", std::chrono::minutes(42)));
  EXPECT_EQ("42h", fmt::format("{}", std::chrono::hours(42)));
  EXPECT_EQ("42[15]s",
            fmt::format("{}",
                        std::chrono::duration<int, std::ratio<15, 1>>(42)));
  EXPECT_EQ("42[15/4]s",
            fmt::format("{}",
                        std::chrono::duration<int, std::ratio<15, 4>>(42)));
}